

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

UBool utrie_set32_63(UNewTrie *trie,UChar32 c,uint32_t value)

{
  int32_t iVar1;
  int32_t block;
  uint32_t value_local;
  UChar32 c_local;
  UNewTrie *trie_local;
  
  if (((trie == (UNewTrie *)0x0) || (trie->isCompacted != '\0')) || (0x10ffff < (uint)c)) {
    trie_local._7_1_ = '\0';
  }
  else {
    iVar1 = utrie_getDataBlock(trie,c);
    if (iVar1 < 0) {
      trie_local._7_1_ = '\0';
    }
    else {
      trie->data[(int)(iVar1 + (c & 0x1fU))] = value;
      trie_local._7_1_ = '\x01';
    }
  }
  return trie_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
utrie_set32(UNewTrie *trie, UChar32 c, uint32_t value) {
    int32_t block;

    /* valid, uncompacted trie and valid c? */
    if(trie==NULL || trie->isCompacted || (uint32_t)c>0x10ffff) {
        return FALSE;
    }

    block=utrie_getDataBlock(trie, c);
    if(block<0) {
        return FALSE;
    }

    trie->data[block+(c&UTRIE_MASK)]=value;
    return TRUE;
}